

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_auth_client.c
# Opt level: O0

void iothub_device_auth_destroy(IOTHUB_SECURITY_HANDLE handle)

{
  IOTHUB_SECURITY_HANDLE handle_local;
  
  if (handle != (IOTHUB_SECURITY_HANDLE)0x0) {
    free(handle->x509_certificate);
    free(handle->x509_alias_key);
    free(handle->sas_token);
    (*handle->hsm_client_destroy)(handle->hsm_client_handle);
    free(handle);
  }
  return;
}

Assistant:

void iothub_device_auth_destroy(IOTHUB_SECURITY_HANDLE handle)
{
    if (handle != NULL)
    {
        free(handle->x509_certificate);
        free(handle->x509_alias_key);
        free(handle->sas_token);
        handle->hsm_client_destroy(handle->hsm_client_handle);
        free(handle);
    }
}